

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void * anon_unknown.dwarf_513c::handle_oom
                 (malloc_fn retry_fn,void *retry_arg,bool from_operator,bool nothrow)

{
  int *piVar1;
  void *pvVar2;
  code *pcVar3;
  undefined8 *puVar4;
  undefined7 in_register_00000011;
  
  piVar1 = __errno_location();
  *piVar1 = 0xc;
  if (((int)CONCAT71(in_register_00000011,from_operator) == 0) && (tc_new_mode == 0)) {
LAB_00115994:
    pvVar2 = (void *)0x0;
  }
  else {
    do {
      pcVar3 = (code *)std::get_new_handler();
      if (pcVar3 == (code *)0x0) {
        if (!nothrow) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar4 = bcmp;
          __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        goto LAB_00115994;
      }
      (*pcVar3)();
      pvVar2 = (*retry_fn)(retry_arg);
    } while (pvVar2 == (void *)0x0);
  }
  return pvVar2;
}

Assistant:

void* handle_oom(malloc_fn retry_fn,
                 void* retry_arg,
                 bool from_operator,
                 bool nothrow) {
  // we hit out of memory condition, usually if it happens we've
  // called sbrk or mmap and failed, and thus errno is set. But there
  // is support for setting up custom system allocator or setting up
  // page heap size limit, in which cases errno may remain
  // untouched.
  //
  // So we set errno here. C++ operator new doesn't require ENOMEM to
  // be set, but doesn't forbid it too (and often C++ oom does happen
  // with ENOMEM set).
  errno = ENOMEM;
  if (!from_operator && !tc_new_mode) {
    // we're out of memory in C library function (malloc etc) and no
    // "new mode" forced on us. Just return nullptr
    return nullptr;
  }

  // we're OOM in operator new or "new mode" is set. We might have to
  // call new_handler and maybe retry allocation.

  for (;;) {
    // Get the current new handler.  NB: this function is not
    // thread-safe.  We make a feeble stab at making it so here, but
    // this lock only protects against tcmalloc interfering with
    // itself, not with other libraries calling set_new_handler.
    std::new_handler nh = std::get_new_handler();
#if __cpp_exceptions
    // If no new_handler is established, the allocation failed.
    if (!nh) {
      if (nothrow) {
        return nullptr;
      }
      throw std::bad_alloc();
    }
    // Otherwise, try the new_handler.  If it returns, retry the
    // allocation.  If it throws std::bad_alloc, fail the allocation.
    // if it throws something else, don't interfere.
    try {
      (*nh)();
    } catch (const std::bad_alloc&) {
      if (!nothrow) throw;
      return nullptr;
    }
#else
    if (!nh) {
      if (nothrow) {
        return nullptr;
      }
      Log(kCrash, __FILE__, __LINE__, "C++ OOM in -fno-exceptions case");
    }
    // Since exceptions are disabled, we don't really know if new_handler
    // failed.  Assume it will abort if it fails.
    (*nh)();
#endif  // !__cpp_exceptions

    // we get here if new_handler returns successfully. So we retry
    // allocation.
    void* rv = retry_fn(retry_arg);
    if (rv != nullptr) {
      return rv;
    }

    // if allocation failed again we go to next loop iteration
  }
}